

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int __thiscall
opengv::absolute_pose::modules::GpnpOptimizationFunctor::operator()
          (GpnpOptimizationFunctor *this,VectorXd *x,VectorXd *fvec)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  Matrix<double,_12,_1,_0,_12,_1> *pMVar4;
  size_t sVar5;
  pointer pMVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  double *pdVar19;
  size_t sVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  undefined1 (*pauVar24) [16];
  long lVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  points_t ccam;
  long local_140;
  iterator iStack_138;
  Matrix<double,_3,_1,_0,_3,_1> *local_130;
  Matrix<double,_3,_1,_0,_3,_1> local_120;
  double adStack_108 [5];
  double local_e0;
  double dStack_d8;
  double dStack_d0;
  double dStack_c8;
  double dStack_c0;
  double dStack_b8;
  double dStack_b0;
  double dStack_a8;
  
  pMVar4 = this->_a;
  adStack_108[1] =
       (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.
       array[0];
  adStack_108[2] =
       (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.
       array[1];
  adStack_108[3] =
       (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.
       array[2];
  adStack_108[4] =
       (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.
       array[3];
  local_e0 = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.
             m_data.array[4];
  dStack_d8 = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.
              m_data.array[5];
  dStack_d0 = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.
              m_data.array[6];
  dStack_c8 = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.
              m_data.array[7];
  dStack_c0 = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.
              m_data.array[8];
  dStack_b8 = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.
              m_data.array[9];
  dStack_b0 = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.
              m_data.array[10];
  dStack_a8 = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.
              m_data.array[0xb];
  sVar5 = this->_dim;
  if (sVar5 != 0) {
    sVar20 = 0;
    pdVar19 = (double *)((long)this->_V + sVar5 * -0x60 + 0x480);
    do {
      dVar3 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
              [sVar20];
      sVar20 = sVar20 + 1;
      dVar9 = *pdVar19;
      pdVar10 = pdVar19 + 1;
      pdVar11 = pdVar19 + 2;
      pdVar12 = pdVar19 + 3;
      pdVar1 = pdVar19 + 4;
      pdVar13 = pdVar19 + 5;
      pdVar14 = pdVar19 + 6;
      pdVar15 = pdVar19 + 7;
      pdVar2 = pdVar19 + 8;
      pdVar16 = pdVar19 + 9;
      pdVar17 = pdVar19 + 10;
      pdVar18 = pdVar19 + 0xb;
      pdVar19 = pdVar19 + 0xc;
      adStack_108[1] = adStack_108[1] + dVar3 * dVar9;
      adStack_108[2] = adStack_108[2] + dVar3 * *pdVar10;
      adStack_108[3] = adStack_108[3] + dVar3 * *pdVar11;
      adStack_108[4] = adStack_108[4] + dVar3 * *pdVar12;
      local_e0 = local_e0 + dVar3 * *pdVar1;
      dStack_d8 = dStack_d8 + dVar3 * *pdVar13;
      dStack_d0 = dStack_d0 + dVar3 * *pdVar14;
      dStack_c8 = dStack_c8 + dVar3 * *pdVar15;
      dStack_c0 = dStack_c0 + dVar3 * *pdVar2;
      dStack_b8 = dStack_b8 + dVar3 * *pdVar16;
      dStack_b0 = dStack_b0 + dVar3 * *pdVar17;
      dStack_a8 = dStack_a8 + dVar3 * *pdVar18;
    } while (sVar5 != sVar20);
  }
  lVar26 = 0x10;
  local_130 = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
  local_140 = 0;
  iStack_138._M_current = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
  do {
    local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = *(double *)((long)adStack_108 + lVar26 + -8);
    local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = *(double *)((long)adStack_108 + lVar26);
    local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = *(double *)((long)adStack_108 + lVar26 + 8);
    if (iStack_138._M_current == local_130) {
      std::
      vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
      ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  *)&local_140,iStack_138,&local_120);
    }
    else {
      ((iStack_138._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
      m_storage.m_data.array[2] =
           local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
      ((iStack_138._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
      m_storage.m_data.array[0] =
           local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
      ((iStack_138._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
      m_storage.m_data.array[1] =
           local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1];
      iStack_138._M_current = iStack_138._M_current + 1;
    }
    lVar26 = lVar26 + 0x18;
  } while (lVar26 != 0x70);
  pdVar19 = (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  lVar21 = 0;
  lVar22 = 0;
  pMVar6 = (this->_c->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar26 = 0;
  do {
    lVar23 = lVar26 + 1;
    pauVar24 = (undefined1 (*) [16])(lVar26 * 0x18 + local_140);
    lVar25 = lVar21;
    do {
      auVar29._8_8_ = 0;
      auVar29._0_8_ =
           *(ulong *)((long)&pMVar6[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data + lVar25 + 0x10);
      auVar7 = vsubpd_avx(*(undefined1 (*) [16])
                           &pMVar6[lVar26].
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data,*(undefined1 (*) [16])
                                    ((long)&pMVar6[1].
                                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                            .m_storage.m_data + lVar25));
      auVar8 = vsubpd_avx(*pauVar24,*(undefined1 (*) [16])(local_140 + 0x18 + lVar25));
      auVar29 = vmovhpd_avx(auVar29,*(undefined8 *)(local_140 + 0x28 + lVar25));
      lVar25 = lVar25 + 0x18;
      auVar28._8_8_ = 0;
      auVar28._0_8_ =
           *(double *)
            ((long)&pMVar6[lVar26].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data + 0x10);
      auVar27 = vmovhpd_avx(auVar28,*(undefined8 *)pauVar24[1]);
      auVar29 = vsubpd_avx(auVar27,auVar29);
      auVar27._0_8_ =
           auVar7._0_8_ * auVar7._0_8_ + auVar7._8_8_ * auVar7._8_8_ + auVar29._0_8_ * auVar29._0_8_
      ;
      auVar27._8_8_ =
           auVar8._0_8_ * auVar8._0_8_ + auVar8._8_8_ * auVar8._8_8_ + auVar29._8_8_ * auVar29._8_8_
      ;
      auVar29 = vhsubpd_avx(auVar27,auVar27);
      dVar3 = (double)vmovlpd_avx(auVar29);
      pdVar19[lVar22] = dVar3;
      lVar22 = lVar22 + 1;
    } while (lVar25 != 0x48);
    lVar21 = lVar21 + 0x18;
    lVar26 = lVar23;
  } while (lVar23 != 3);
  if (local_140 != 0) {
    free(*(void **)(local_140 + -8));
  }
  return 0;
}

Assistant:

int operator()(const VectorXd &x, VectorXd &fvec) const
  {
    assert( x.size() == _dim );
    assert( (unsigned int) fvec.size() == 6);

    Eigen::Matrix<double,12,1> solution = _a;
    for(size_t i = 0; i < _dim; i++)
      solution += x[i]*_V.col(12-_dim+i);

    points_t ccam;
    for(size_t i = 0; i<4; i++)
      ccam.push_back(solution.block<3,1>(i*3,0));

    Eigen::Vector3d diffw;
    Eigen::Vector3d diffc;
    size_t index = 0;

    for(size_t i = 0; i<3; i++)
    {
      for(size_t j = i+1; j < 4; j++)
      {
        diffw = _c[i]-_c[j];
        diffc = ccam[i]-ccam[j];
        fvec[index++] = diffw.dot(diffw)-diffc.dot(diffc);
      }
    }

    return 0;
  }